

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalInterfaceTiledExamples.cpp
# Opt level: O2

void readTiled1(char *fileName,Array2D<GZ> *pixels,int *width,int *height)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  TiledInputFile in;
  FrameBuffer frameBuffer;
  Slice local_68 [56];
  
  iVar1 = Imf_3_2::globalThreadCount();
  Imf_3_2::TiledInputFile::TiledInputFile(&in,fileName,iVar1);
  Imf_3_2::TiledInputFile::header();
  piVar3 = (int *)Imf_3_2::Header::dataWindow();
  iVar1 = *piVar3;
  iVar2 = piVar3[1];
  iVar5 = piVar3[3];
  *width = (piVar3[2] - iVar1) + 1;
  lVar4 = ((long)iVar5 - (long)iVar2) + 1;
  *height = (int)lVar4;
  Imf_3_2::Array2D<GZ>::resizeErase(pixels,lVar4,(long)*width);
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar4 = -(long)iVar2;
  lVar6 = (long)-iVar1;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Imf_3_2::Slice::Slice
            (local_68,HALF,(char *)(pixels->_data + pixels->_sizeY * lVar4 + lVar6),8,
             (long)*width << 3,1,1,0.0,false,false);
  Imf_3_2::FrameBuffer::insert((char *)&frameBuffer,(Slice *)"G");
  Imf_3_2::Slice::Slice
            (local_68,FLOAT,(char *)&pixels->_data[lVar4 * pixels->_sizeY + lVar6].z,8,
             (long)*width << 3,1,1,0.0,false,false);
  Imf_3_2::FrameBuffer::insert((char *)&frameBuffer,(Slice *)"Z");
  Imf_3_2::TiledInputFile::setFrameBuffer((FrameBuffer *)&in);
  iVar5 = (int)&in;
  iVar1 = Imf_3_2::TiledInputFile::numXTiles(iVar5);
  iVar2 = Imf_3_2::TiledInputFile::numYTiles(iVar5);
  Imf_3_2::TiledInputFile::readTiles(iVar5,0,iVar1 + -1,0,iVar2 + -1);
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
               *)&frameBuffer);
  Imf_3_2::TiledInputFile::~TiledInputFile(&in);
  return;
}

Assistant:

void
readTiled1 (const char fileName[], Array2D<GZ>& pixels, int& width, int& height)
{
    TiledInputFile in (fileName);

    Box2i dw = in.header ().dataWindow ();
    width    = dw.max.x - dw.min.x + 1;
    height   = dw.max.y - dw.min.y + 1;
    int dx   = dw.min.x;
    int dy   = dw.min.y;

    pixels.resizeErase (height, width);

    FrameBuffer frameBuffer;

    frameBuffer.insert (
        "G", // name
        Slice (
            IMF::HALF,                       // type
            (char*) &pixels[-dy][-dx].g,     // base
            sizeof (pixels[0][0]) * 1,       // xStride
            sizeof (pixels[0][0]) * width)); // yStride

    frameBuffer.insert (
        "Z", // name
        Slice (
            IMF::FLOAT,                      // type
            (char*) &pixels[-dy][-dx].z,     // base
            sizeof (pixels[0][0]) * 1,       // xStride
            sizeof (pixels[0][0]) * width)); // yStride

    in.setFrameBuffer (frameBuffer);
    in.readTiles (0, in.numXTiles () - 1, 0, in.numYTiles () - 1);
}